

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonCodec.cc
# Opt level: O3

size_t __thiscall
avro::parsing::JsonDecoder<avro::parsing::SimpleParser<avro::parsing::JsonDecoderHandler>_>::
decodeUnionIndex(JsonDecoder<avro::parsing::SimpleParser<avro::parsing::JsonDecoderHandler>_> *this)

{
  JsonParser *this_00;
  SimpleParser<avro::parsing::JsonDecoderHandler> *this_01;
  pointer pcVar1;
  Token TVar2;
  size_t n;
  string local_38;
  
  this_01 = &this->parser_;
  SimpleParser<avro::parsing::JsonDecoderHandler>::advance(this_01,sUnion);
  this_00 = &this->in_;
  if ((this->in_).peeked == true) {
    TVar2 = (this->in_).curToken;
  }
  else {
    TVar2 = json::JsonParser::doAdvance(this_00);
    (this->in_).curToken = TVar2;
    (this->in_).peeked = true;
  }
  if (TVar2 == tkNull) {
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"null","");
    n = SimpleParser<avro::parsing::JsonDecoderHandler>::indexForName(this_01,&local_38);
  }
  else {
    json::JsonParser::expectToken(this_00,tkObjectStart);
    json::JsonParser::expectToken(this_00,tkString);
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    pcVar1 = (this->in_).sv._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_38,pcVar1,pcVar1 + (this->in_).sv._M_string_length);
    n = SimpleParser<avro::parsing::JsonDecoderHandler>::indexForName(this_01,&local_38);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  SimpleParser<avro::parsing::JsonDecoderHandler>::selectBranch(this_01,n);
  return n;
}

Assistant:

size_t JsonDecoder<P>::decodeUnionIndex()
{
    parser_.advance(Symbol::sUnion);

    size_t result;
    if (in_.peek() == JsonParser::tkNull) {
        result = parser_.indexForName("null");
    } else {
        expect(JsonParser::tkObjectStart);
        expect(JsonParser::tkString);
        result = parser_.indexForName(in_.stringValue());
    }
    parser_.selectBranch(result);
    return result;
}